

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEdit::keyReleaseEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  long lVar1;
  Duration duration;
  uint uVar2;
  QKeySequenceEditPrivate *pQVar3;
  QKeySequenceEditPrivate *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int __fd;
  QKeyEvent *in_RSI;
  QKeyEvent *pQVar4;
  QKeySequenceEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QKeySequenceEditPrivate *d;
  QBasicTimer *__d;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  pQVar3 = d_func((QKeySequenceEdit *)0x5a7b1f);
  __fd = (int)pQVar4;
  uVar5 = pQVar3->prevKey;
  uVar2 = QKeyEvent::key(in_RSI);
  __addr_len = (QKeySequenceEditPrivate *)(ulong)uVar2;
  __addr = extraout_RDX;
  if (uVar5 == uVar2) {
    if (pQVar3->keyNum < pQVar3->maximumSequenceLength) {
      __d = &pQVar3->releaseTimer;
      s<(char)49>();
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
                 (duration<long,_std::ratio<1L,_1L>_> *)__d);
      duration.__r._4_4_ = uVar5;
      duration.__r._0_4_ = in_stack_ffffffffffffffc8;
      __fd = local_10;
      QBasicTimer::start(__d,duration,(QObject *)0x5a7b9a);
      __addr_len = pQVar3;
      __addr = extraout_RDX_00;
    }
    else {
      QKeySequenceEditPrivate::finishEditing(in_RDI);
      __addr_len = pQVar3;
      __addr = extraout_RDX_01;
    }
  }
  QEvent::accept((QEvent *)in_RSI,__fd,__addr,(socklen_t *)__addr_len);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKeySequenceEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->prevKey == e->key()) {
        if (d->keyNum < d->maximumSequenceLength)
            d->releaseTimer.start(1s, this);
        else
            d->finishEditing();
    }
    e->accept();
}